

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cpp
# Opt level: O1

void __thiscall
CAtEmLogging::SetLogMsgBuf(CAtEmLogging *this,EC_T_BYTE *pbyLogMem,EC_T_DWORD dwSize)

{
  MSG_BUFFER_DESC *pMVar1;
  
  pMVar1 = this->m_pAllMsgBufferDesc;
  pMVar1->pbyNextLogMsg = pbyLogMem;
  pMVar1->dwLogMemorySize = dwSize;
  pMVar1->bLogBufferFull = 0;
  pMVar1->bNewLine = 1;
  memset(pbyLogMem,0,(ulong)dwSize);
  pMVar1->pbyLogMemory = pbyLogMem;
  return;
}

Assistant:

EC_T_VOID CAtEmLogging::SetLogMsgBuf( EC_T_BYTE* pbyLogMem, EC_T_DWORD dwSize )
{
    SetMsgBuf( m_pAllMsgBufferDesc, pbyLogMem, dwSize );
}